

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O3

size_t __thiscall
google::protobuf::internal::ExtensionSet::Extension::SpaceUsedExcludingSelfLong(Extension *this)

{
  int iVar1;
  size_t sVar2;
  Message *this_00;
  undefined4 extraout_var;
  size_t sVar3;
  bool bVar4;
  bool bVar5;
  
  iVar1 = *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)this->type * 4);
  if (this->is_repeated != true) {
    if (iVar1 == 10) {
      if ((this->field_0xa & 4) == 0) {
        this_00 = DownCastMessage<google::protobuf::Message>
                            ((MessageLite *)(this->field_0).int64_t_value);
        sVar2 = Message::SpaceUsedLong(this_00);
        return sVar2;
      }
      iVar1 = (*((MessageLite *)(this->field_0).int64_t_value)->_vptr_MessageLite[0xe])();
      return CONCAT44(extraout_var,iVar1);
    }
    if (iVar1 == 9) {
      sVar2 = StringSpaceUsedExcludingSelfLong((string *)this->field_0);
      return sVar2 + 0x20;
    }
LAB_001e1d8e:
    return 0;
  }
  switch(iVar1) {
  case 1:
  case 3:
  case 6:
  case 8:
    iVar1 = 2;
    if ((*(byte *)(this->field_0).int64_t_value & 4) != 0) {
      iVar1 = *(int *)((byte *)(this->field_0).int64_t_value + 0xc);
    }
    bVar5 = SBORROW4(iVar1,3);
    bVar4 = iVar1 + -3 < 0;
    sVar2 = (long)iVar1 * 4 + 0x18;
    break;
  case 2:
  case 4:
  case 5:
    iVar1 = 1;
    if ((*(byte *)(this->field_0).int64_t_value & 4) != 0) {
      iVar1 = *(int *)((byte *)(this->field_0).int64_t_value + 0xc);
    }
    bVar5 = SBORROW4(iVar1,2);
    bVar4 = iVar1 + -2 < 0;
    sVar2 = (long)iVar1 * 8 + 0x18;
    break;
  case 7:
    iVar1 = 3;
    if ((*(byte *)(this->field_0).int64_t_value & 4) != 0) {
      iVar1 = *(int *)((byte *)(this->field_0).int64_t_value + 0xc);
    }
    sVar2 = (long)iVar1 + 0x18;
    bVar5 = SBORROW4(iVar1,4);
    bVar4 = iVar1 + -4 < 0;
    break;
  case 9:
    sVar2 = RepeatedPtrFieldBase::
            SpaceUsedExcludingSelfLong<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                      ((RepeatedPtrFieldBase *)this->field_0);
    goto LAB_001e1d98;
  case 10:
    sVar2 = RepeatedPtrFieldBase::
            SpaceUsedExcludingSelfLong<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
                      ((RepeatedPtrFieldBase *)this->field_0);
LAB_001e1d98:
    return sVar2 + 0x18;
  default:
    goto LAB_001e1d8e;
  }
  sVar3 = 0x10;
  if (bVar5 == bVar4) {
    sVar3 = sVar2;
  }
  return sVar3;
}

Assistant:

size_t ExtensionSet::Extension::SpaceUsedExcludingSelfLong() const {
  size_t total_size = 0;
  if (is_repeated) {
    switch (cpp_type(type)) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)                               \
  case FieldDescriptor::CPPTYPE_##UPPERCASE:                            \
    total_size +=                                                       \
        sizeof(*ptr.repeated_##LOWERCASE##_value) +                     \
        ptr.repeated_##LOWERCASE##_value->SpaceUsedExcludingSelfLong(); \
    break

      HANDLE_TYPE(INT32, int32_t);
      HANDLE_TYPE(INT64, int64_t);
      HANDLE_TYPE(UINT32, uint32_t);
      HANDLE_TYPE(UINT64, uint64_t);
      HANDLE_TYPE(FLOAT, float);
      HANDLE_TYPE(DOUBLE, double);
      HANDLE_TYPE(BOOL, bool);
      HANDLE_TYPE(ENUM, enum);
      HANDLE_TYPE(STRING, string);
#undef HANDLE_TYPE

      case FieldDescriptor::CPPTYPE_MESSAGE:
        // repeated_message_value is actually a RepeatedPtrField<MessageLite>,
        // but MessageLite has no SpaceUsedLong(), so we must directly call
        // RepeatedPtrFieldBase::SpaceUsedExcludingSelfLong() with a different
        // type handler.
        total_size += sizeof(*ptr.repeated_message_value) +
                      RepeatedMessage_SpaceUsedExcludingSelfLong(
                          reinterpret_cast<internal::RepeatedPtrFieldBase*>(
                              ptr.repeated_message_value));
        break;
    }
  } else {
    switch (cpp_type(type)) {
      case FieldDescriptor::CPPTYPE_STRING:
        total_size += sizeof(*ptr.string_value) +
                      StringSpaceUsedExcludingSelfLong(*ptr.string_value);
        break;
      case FieldDescriptor::CPPTYPE_MESSAGE:
        if (is_lazy) {
          total_size += ptr.lazymessage_value->SpaceUsedLong();
        } else {
          total_size +=
              DownCastMessage<Message>(ptr.message_value)->SpaceUsedLong();
        }
        break;
      default:
        // No extra storage costs for primitive types.
        break;
    }
  }
  return total_size;
}